

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::EnumValueMember
          (GoGenerator *this,EnumDef *enum_def,EnumVal *ev,size_t max_name_length,string *code_ptr)

{
  string local_48;
  
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_48,(char)max_name_length - (char)(ev->name)._M_string_length);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_48);
  IdlNamer::EnumVariant_abi_cxx11_(&local_48,&this->namer_,enum_def,ev);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void EnumValueMember(const EnumDef &enum_def, const EnumVal &ev,
                       size_t max_name_length, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "\t\"";
    code += ev.name;
    code += "\": ";
    code += std::string(max_name_length - ev.name.length(), ' ');
    code += namer_.EnumVariant(enum_def, ev);
    code += ",\n";
  }